

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O3

void __thiscall axl::sys::TlsMgr::~TlsMgr(TlsMgr *this)

{
  BoxListEntry<axl::rc::Ptr<void>_> *pBVar1;
  ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
  *this_00;
  BoxListEntry<axl::rc::Ptr<void>_> *p;
  Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_> local_29;
  
  this_00 = (ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
             *)pthread_getspecific(this->m_tlsKey);
  if (this_00 !=
      (ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
       *)0x0) {
    if ((BoxListEntry<axl::rc::Ptr<void>_> *)this_00[1].m_p !=
        (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
      p = (BoxListEntry<axl::rc::Ptr<void>_> *)this_00[1].m_p;
      do {
        pBVar1 = (BoxListEntry<axl::rc::Ptr<void>_> *)(p->super_ListLink).m_next;
        mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>::operator()(&local_29,p);
        p = pBVar1;
      } while (pBVar1 != (BoxListEntry<axl::rc::Ptr<void>_> *)0x0);
      this_00[1].m_p = (BoxListEntry<axl::rc::Ptr<void>_> **)0x0;
      this_00[1].m_hdr = (Hdr *)0x0;
      this_00[1].m_count = 0;
    }
    sl::
    ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
    ::release(this_00);
    operator_delete(this_00);
    pthread_setspecific(this->m_tlsKey,(void *)0x0);
  }
  pthread_key_delete(this->m_tlsKey);
  return;
}

Assistant:

TlsMgr::~TlsMgr() {
	Page* page = findCurrentThreadPage();
	if (page) {
		delete page;
		setCurrentThreadPage(NULL);
	}

	::pthread_key_delete(m_tlsKey);
}